

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::HierarchicalSoftmaxLoss::buildTree
          (HierarchicalSoftmaxLoss *this,vector<long,_std::allocator<long>_> *counts)

{
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  *this_00;
  long lVar1;
  pointer plVar2;
  pointer pNVar3;
  uint uVar4;
  uint uVar5;
  pointer pNVar6;
  int32_t i;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int32_t j;
  int32_t mini [2];
  vector<int,_std::allocator<int>_> path;
  int local_84;
  _Bvector_base<std::allocator<bool>_> local_80;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *local_58;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  this_00 = &this->tree_;
  std::
  vector<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
  ::resize(this_00,(long)this->osz_ * 2 - 1);
  uVar5 = this->osz_;
  pNVar6 = (this->tree_).
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(int)uVar5;
  lVar1 = lVar9 * 2 + -1;
  uVar10 = (uint)lVar1;
  for (lVar13 = 0; (ulong)(~((int)uVar10 >> 0x1f) & uVar10) << 5 != lVar13; lVar13 = lVar13 + 0x20)
  {
    *(undefined8 *)((long)&pNVar6->parent + lVar13) = 0xffffffffffffffff;
    *(undefined4 *)((long)&pNVar6->right + lVar13) = 0xffffffff;
    *(undefined8 *)((long)&pNVar6->count + lVar13) = 1000000000000000;
    (&pNVar6->binary)[lVar13] = false;
  }
  plVar2 = (counts->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pNVar6 = (this_00->
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar13 = 0; (ulong)(~((int)uVar5 >> 0x1f) & uVar5) << 3 != lVar13; lVar13 = lVar13 + 8) {
    *(undefined8 *)((long)&pNVar6->count + lVar13 * 4) = *(undefined8 *)((long)plVar2 + lVar13);
  }
  pNVar6 = (this_00->
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = (ulong)(uVar5 - 1);
  uVar10 = uVar5;
  for (; lVar9 < lVar1; lVar9 = lVar9 + 1) {
    local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    pNVar3 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
      uVar11 = (uint)uVar12;
      if (((int)uVar11 < 0) || (pNVar3[(int)uVar10].count <= pNVar3[uVar12].count)) {
        uVar4 = uVar10 + 1;
        uVar11 = uVar10;
      }
      else {
        uVar12 = (ulong)(uVar11 - 1);
        uVar4 = uVar10;
      }
      uVar10 = uVar4;
      *(uint *)((long)&local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                       _M_p + lVar13 * 4) = uVar11;
    }
    pNVar6[lVar9].left =
         (int)local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar13 = (long)local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                   _4_4_;
    pNVar6[lVar9].right =
         local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_;
    pNVar6[lVar9].count =
         pNVar6[lVar13].count +
         pNVar6[(int)local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                     _M_p].count;
    pNVar6[(int)local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p].
    parent = (int32_t)lVar9;
    pNVar6[lVar13].parent = (int32_t)lVar9;
    pNVar6[lVar13].binary = true;
  }
  local_50 = &this->paths_;
  local_58 = &this->codes_;
  for (iVar8 = 0; iVar8 < (int)uVar5; iVar8 = iVar8 + 1) {
    local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_80._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pNVar6 = (this_00->
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar7 = iVar8;
    while( true ) {
      if (pNVar6[iVar7].parent == -1) break;
      local_84 = pNVar6[iVar7].parent - this->osz_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_84);
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&local_80,
                 (this_00->
                 super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
                 )._M_impl.super__Vector_impl_data._M_start[iVar7].binary);
      pNVar6 = (this_00->
               super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar7 = pNVar6[iVar7].parent;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(local_50,(value_type *)&local_48);
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::push_back(local_58,(value_type *)&local_80);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    uVar5 = this->osz_;
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::buildTree(const std::vector<int64_t>& counts) {
  tree_.resize(2 * osz_ - 1);
  for (int32_t i = 0; i < 2 * osz_ - 1; i++) {
    tree_[i].parent = -1;
    tree_[i].left = -1;
    tree_[i].right = -1;
    tree_[i].count = 1e15;
    tree_[i].binary = false;
  }
  for (int32_t i = 0; i < osz_; i++) {
    tree_[i].count = counts[i];
  }
  int32_t leaf = osz_ - 1;
  int32_t node = osz_;
  for (int32_t i = osz_; i < 2 * osz_ - 1; i++) {
    int32_t mini[2] = {0};
    for (int32_t j = 0; j < 2; j++) {
      if (leaf >= 0 && tree_[leaf].count < tree_[node].count) {
        mini[j] = leaf--;
      } else {
        mini[j] = node++;
      }
    }
    tree_[i].left = mini[0];
    tree_[i].right = mini[1];
    tree_[i].count = tree_[mini[0]].count + tree_[mini[1]].count;
    tree_[mini[0]].parent = i;
    tree_[mini[1]].parent = i;
    tree_[mini[1]].binary = true;
  }
  for (int32_t i = 0; i < osz_; i++) {
    std::vector<int32_t> path;
    std::vector<bool> code;
    int32_t j = i;
    while (tree_[j].parent != -1) {
      path.push_back(tree_[j].parent - osz_);
      code.push_back(tree_[j].binary);
      j = tree_[j].parent;
    }
    paths_.push_back(path);
    codes_.push_back(code);
  }
}